

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::makefacetverticesmap(tetgenmesh *this)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  memorypool *pmVar4;
  void **ppvVar5;
  char **ppcVar6;
  arraypool *this_00;
  void *pvVar7;
  arraypool *paVar8;
  char *pcVar9;
  char *pcVar10;
  arraypool *paVar11;
  int *piVar12;
  point *ppdVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  
  if (this->b->verbose != 0) {
    puts("  Creating the facet vertices map.");
  }
  this_00 = (arraypool *)operator_new(0x30);
  this_00->objectbytes = 8;
  this_00->objectsperblock = 0x400;
  this_00->log2objectsperblock = 10;
  this_00->objectsperblockmark = 0x3ff;
  this_00->toparraylen = 0;
  this_00->toparray = (char **)0x0;
  this_00->objects = 0;
  this_00->totalmemory = 0;
  pmVar4 = this->subfaces;
  ppvVar5 = pmVar4->firstblock;
  pmVar4->pathblock = ppvVar5;
  pmVar4->pathitem =
       (void *)((long)ppvVar5 +
               (((long)pmVar4->alignbytes + 8U) -
               (ulong)(ppvVar5 + 1) % (ulong)(long)pmVar4->alignbytes));
  pmVar4->pathitemsleft = pmVar4->itemsperblock;
  do {
    pvVar7 = memorypool::traverse(pmVar4);
    if (pvVar7 == (void *)0x0) {
      pvVar7 = (void *)0x0;
      break;
    }
  } while (*(long *)((long)pvVar7 + 0x18) == 0);
  if (pvVar7 == (void *)0x0) {
    uVar21 = 0;
    iVar14 = 0;
  }
  else {
    iVar14 = 0;
    uVar21 = 0;
    do {
      if ((*(byte *)((long)pvVar7 + (long)this->shmarkindex * 4 + 4) & 1) == 0) {
        paVar8 = (arraypool *)operator_new(0x30);
        paVar8->objectbytes = 8;
        paVar8->objectsperblock = 0x100;
        paVar8->log2objectsperblock = 8;
        paVar8->objectsperblockmark = 0xff;
        paVar8->toparraylen = 0;
        paVar8->toparray = (char **)0x0;
        paVar8->objects = 0;
        paVar8->totalmemory = 0;
        lVar15 = 3;
        do {
          lVar16 = *(long *)((long)pvVar7 + lVar15 * 8);
          uVar2 = *(uint *)(lVar16 + 4 + (long)this->pointmarkindex * 4);
          if (((int)uVar2 >> 8) - 8U < 0xfffffffe) {
            *(uint *)(lVar16 + 4 + (long)this->pointmarkindex * 4) = uVar2 | 1;
            pcVar9 = arraypool::getblock(paVar8,(int)paVar8->objects);
            uVar18 = paVar8->objects;
            paVar8->objects = uVar18 + 1;
            *(undefined8 *)
             (pcVar9 + (long)paVar8->objectbytes * ((long)paVar8->objectsperblock - 1U & uVar18)) =
                 *(undefined8 *)((long)pvVar7 + lVar15 * 8);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 != 6);
        puVar1 = (uint *)((long)pvVar7 + (long)this->shmarkindex * 4 + 4);
        *puVar1 = *puVar1 | 1;
        paVar11 = this->caveshlist;
        pcVar9 = arraypool::getblock(paVar11,(int)paVar11->objects);
        lVar15 = (long)paVar11->objectbytes *
                 ((long)paVar11->objectsperblock - 1U & paVar11->objects);
        paVar11->objects = paVar11->objects + 1;
        *(void **)(pcVar9 + lVar15) = pvVar7;
        pcVar9 = pcVar9 + lVar15 + 8;
        pcVar9[0] = '\0';
        pcVar9[1] = '\0';
        pcVar9[2] = '\0';
        pcVar9[3] = '\0';
        paVar11 = this->caveshlist;
        if (0 < paVar11->objects) {
          lVar15 = 0;
          do {
            pcVar9 = paVar11->toparray[(uint)lVar15 >> ((byte)paVar11->log2objectsperblock & 0x1f)];
            lVar16 = (long)paVar11->objectbytes *
                     (long)(int)(paVar11->objectsperblockmark & (uint)lVar15);
            *(uint *)(*(long *)(pcVar9 + lVar16) + 8 + (long)this->shmarkindex * 4) = uVar21;
            iVar19 = 3;
            do {
              if (*(long *)(*(long *)(pcVar9 + lVar16) + 0x30 +
                           (long)(*(int *)(pcVar9 + lVar16 + 8) >> 1) * 8) == 0) {
                uVar18 = *(ulong *)(*(long *)(pcVar9 + lVar16) +
                                   (long)(*(int *)(pcVar9 + lVar16 + 8) >> 1) * 8);
                uVar22 = uVar18 & 0xfffffffffffffff8;
                if ((*(byte *)(uVar22 + 4 + (long)this->shmarkindex * 4) & 1) == 0) {
                  uVar20 = (uint)uVar18;
                  lVar17 = *(long *)(uVar22 + (long)sapexpivot[uVar20 & 7] * 8);
                  uVar2 = *(uint *)(lVar17 + 4 + (long)this->pointmarkindex * 4);
                  if (((uVar2 & 1) == 0) && (((int)uVar2 >> 8) - 8U < 0xfffffffe)) {
                    *(uint *)(lVar17 + 4 + (long)this->pointmarkindex * 4) = uVar2 | 1;
                    pcVar10 = arraypool::getblock(paVar8,(int)paVar8->objects);
                    uVar18 = paVar8->objects;
                    paVar8->objects = uVar18 + 1;
                    *(long *)(pcVar10 +
                             (long)paVar8->objectbytes *
                             ((long)paVar8->objectsperblock - 1U & uVar18)) = lVar17;
                  }
                  puVar1 = (uint *)(uVar22 + 4 + (long)this->shmarkindex * 4);
                  *puVar1 = *puVar1 | 1;
                  paVar11 = this->caveshlist;
                  pcVar10 = arraypool::getblock(paVar11,(int)paVar11->objects);
                  lVar17 = (long)paVar11->objectbytes *
                           ((long)paVar11->objectsperblock - 1U & paVar11->objects);
                  paVar11->objects = paVar11->objects + 1;
                  *(ulong *)(pcVar10 + lVar17) = uVar22;
                  *(uint *)(pcVar10 + lVar17 + 8) = uVar20 & 7;
                }
              }
              *(int *)(pcVar9 + lVar16 + 8) = snextpivot[*(int *)(pcVar9 + lVar16 + 8)];
              iVar19 = iVar19 + -1;
            } while (iVar19 != 0);
            lVar15 = lVar15 + 1;
            paVar11 = this->caveshlist;
          } while (lVar15 < paVar11->objects);
        }
        lVar15 = paVar8->objects;
        if (0 < lVar15) {
          ppcVar6 = paVar8->toparray;
          lVar16 = 0;
          do {
            puVar1 = (uint *)(*(long *)(ppcVar6[(uint)lVar16 >>
                                                ((byte)paVar8->log2objectsperblock & 0x1f)] +
                                       (long)paVar8->objectbytes *
                                       (long)(int)(paVar8->objectsperblockmark & (uint)lVar16)) + 4
                             + (long)this->pointmarkindex * 4);
            *puVar1 = *puVar1 & 0xfffffffe;
            lVar16 = lVar16 + 1;
          } while (lVar15 != lVar16);
        }
        iVar14 = iVar14 + (int)lVar15;
        paVar11->objects = 0;
        pcVar9 = arraypool::getblock(this_00,(int)this_00->objects);
        uVar18 = this_00->objects;
        this_00->objects = uVar18 + 1;
        *(arraypool **)
         (pcVar9 + (long)this_00->objectbytes * ((long)this_00->objectsperblock - 1U & uVar18)) =
             paVar8;
        uVar21 = uVar21 + 1;
      }
      pmVar4 = this->subfaces;
      do {
        pvVar7 = memorypool::traverse(pmVar4);
        if (pvVar7 == (void *)0x0) {
          pvVar7 = (void *)0x0;
          break;
        }
      } while (*(long *)((long)pvVar7 + 0x18) == 0);
    } while (pvVar7 != (void *)0x0);
  }
  pmVar4 = this->subfaces;
  ppvVar5 = pmVar4->firstblock;
  pmVar4->pathblock = ppvVar5;
  pmVar4->pathitem =
       (void *)((long)ppvVar5 +
               (((long)pmVar4->alignbytes + 8U) -
               (ulong)(ppvVar5 + 1) % (ulong)(long)pmVar4->alignbytes));
  pmVar4->pathitemsleft = pmVar4->itemsperblock;
  do {
    pvVar7 = memorypool::traverse(pmVar4);
    if (pvVar7 == (void *)0x0) goto LAB_0013b9fa;
  } while (*(long *)((long)pvVar7 + 0x18) == 0);
LAB_0013b9fc:
  do {
    if (pvVar7 == (void *)0x0) {
      if (this->b->verbose != 0) {
        printf("  Found %ld facets.\n");
      }
      uVar18 = (long)(int)uVar21 * 4 + 4;
      if ((int)uVar21 < -1) {
        uVar18 = 0xffffffffffffffff;
      }
      piVar12 = (int *)operator_new__(uVar18);
      this->idx2facetlist = piVar12;
      uVar18 = 0xffffffffffffffff;
      if (-1 < iVar14) {
        uVar18 = (long)iVar14 * 8;
      }
      ppdVar13 = (point *)operator_new__(uVar18);
      this->facetverticeslist = ppdVar13;
      this->totalworkmemory = this->totalworkmemory + (long)iVar14 * 8 + (long)(int)uVar21 * 4 + 4;
      *piVar12 = 0;
      if (0 < (int)uVar21) {
        uVar18 = 0;
        iVar14 = 0;
        do {
          piVar12 = *(int **)(this_00->toparray
                              [(uint)uVar18 >> ((byte)this_00->log2objectsperblock & 0x1f)] +
                             (long)this_00->objectbytes *
                             (long)(int)(this_00->objectsperblockmark & (uint)uVar18));
          lVar15 = *(long *)(piVar12 + 8);
          this->idx2facetlist[uVar18 + 1] = this->idx2facetlist[uVar18] + (int)lVar15;
          if (0 < lVar15) {
            iVar19 = piVar12[2];
            uVar2 = piVar12[3];
            iVar3 = *piVar12;
            lVar16 = 0;
            do {
              this->facetverticeslist[iVar14 + lVar16] =
                   *(point *)(*(long *)(*(long *)(piVar12 + 6) +
                                       (ulong)((uint)lVar16 >> ((byte)iVar19 & 0x1f)) * 8) +
                             (long)(int)((uint)lVar16 & uVar2) * (long)iVar3);
              lVar16 = lVar16 + 1;
            } while (lVar15 != lVar16);
            iVar14 = iVar14 + (int)lVar16;
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar21);
      }
      if (0 < this_00->objects) {
        lVar15 = 0;
        do {
          paVar8 = *(arraypool **)
                    (this_00->toparray[(uint)lVar15 >> ((byte)this_00->log2objectsperblock & 0x1f)]
                    + (long)this_00->objectbytes *
                      (long)(int)(this_00->objectsperblockmark & (uint)lVar15));
          if (paVar8 != (arraypool *)0x0) {
            arraypool::~arraypool(paVar8);
            operator_delete(paVar8,0x30);
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < this_00->objects);
      }
      arraypool::~arraypool(this_00);
      operator_delete(this_00,0x30);
      return;
    }
    puVar1 = (uint *)((long)pvVar7 + (long)this->shmarkindex * 4 + 4);
    *puVar1 = *puVar1 & 0xfffffffe;
    pmVar4 = this->subfaces;
    do {
      pvVar7 = memorypool::traverse(pmVar4);
      if (pvVar7 == (void *)0x0) goto LAB_0013b9fa;
    } while (*(long *)((long)pvVar7 + 0x18) == 0);
  } while( true );
LAB_0013b9fa:
  pvVar7 = (void *)0x0;
  goto LAB_0013b9fc;
}

Assistant:

void tetgenmesh::makefacetverticesmap()
{
  arraypool *facetvertexlist, *vertlist, **paryvertlist;
  face subloop, neighsh, *parysh, *parysh1;
  point pa, *ppt, *parypt;
  verttype vt;
  int facetindex, totalvertices;
  int i, j, k;

  if (b->verbose) {
    printf("  Creating the facet vertices map.\n");
  }

  facetvertexlist = new arraypool(sizeof(arraypool *), 10);
  facetindex = totalvertices = 0;

  subfaces->traversalinit();
  subloop.sh = shellfacetraverse(subfaces);
  while (subloop.sh != NULL) {
    if (!sinfected(subloop)) {
      // A new facet. Create its vertices list.
      vertlist = new arraypool(sizeof(point *), 8);
      ppt = (point *) &(subloop.sh[3]);
      for (k = 0; k < 3; k++) {
        vt = pointtype(ppt[k]);
        if ((vt != FREESEGVERTEX) && (vt != FREEFACETVERTEX)) {
          pinfect(ppt[k]);
          vertlist->newindex((void **) &parypt);
          *parypt = ppt[k];
        }
      }
      sinfect(subloop);
      caveshlist->newindex((void **) &parysh);
      *parysh = subloop;
      for (i = 0; i < caveshlist->objects; i++) {
        parysh = (face *) fastlookup(caveshlist, i);
        setfacetindex(*parysh, facetindex);
        for (j = 0; j < 3; j++) {
          if (!isshsubseg(*parysh)) {
            spivot(*parysh, neighsh);
            if (!sinfected(neighsh)) {
              pa = sapex(neighsh);
              if (!pinfected(pa)) {
                vt = pointtype(pa);
                if ((vt != FREESEGVERTEX) && (vt != FREEFACETVERTEX)) {
                  pinfect(pa);
                  vertlist->newindex((void **) &parypt);
                  *parypt = pa;
                }
              }
              sinfect(neighsh);
              caveshlist->newindex((void **) &parysh1);
              *parysh1 = neighsh;
            }
          }
          senextself(*parysh);
        }
      } // i
      totalvertices += (int) vertlist->objects;
      // Uninfect facet vertices.
      for (k = 0; k < vertlist->objects; k++) {
        parypt = (point *) fastlookup(vertlist, k);
        puninfect(*parypt);
      }
      caveshlist->restart();
      // Save this vertex list.
      facetvertexlist->newindex((void **) &paryvertlist);
      *paryvertlist = vertlist;
      facetindex++;
    } 
    subloop.sh = shellfacetraverse(subfaces);
  }

  // All subfaces are infected. Uninfect them.
  subfaces->traversalinit();
  subloop.sh = shellfacetraverse(subfaces);
  while (subloop.sh != NULL) {
    suninfect(subloop);
    subloop.sh = shellfacetraverse(subfaces);
  }

  if (b->verbose) {
    printf("  Found %ld facets.\n", facetvertexlist->objects);
  }

  idx2facetlist = new int[facetindex + 1];
  facetverticeslist = new point[totalvertices];

  totalworkmemory += ((facetindex + 1) * sizeof(int) + 
                      totalvertices * sizeof(point *));

  idx2facetlist[0] = 0;
  for (i = 0, k = 0; i < facetindex; i++) {
    paryvertlist = (arraypool **) fastlookup(facetvertexlist, i);
    vertlist = *paryvertlist;
    idx2facetlist[i + 1] = (idx2facetlist[i] + (int) vertlist->objects);
    for (j = 0; j < vertlist->objects; j++) {
      parypt = (point *) fastlookup(vertlist, j);
      facetverticeslist[k] = *parypt;
      k++;
    }
  }

  // Free the lists.
  for (i = 0; i < facetvertexlist->objects; i++) {
    paryvertlist = (arraypool **) fastlookup(facetvertexlist, i);
    vertlist = *paryvertlist;
    delete vertlist;
  }
  delete facetvertexlist;
}